

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
__thiscall
duckdb::Connection::Prepare
          (Connection *this,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement)

{
  long *plVar1;
  ClientContext *statement_00;
  long *in_RDX;
  pointer *__ptr;
  
  statement_00 = shared_ptr<duckdb::ClientContext,_true>::operator->
                           ((shared_ptr<duckdb::ClientContext,_true> *)statement);
  plVar1 = (long *)*in_RDX;
  *in_RDX = 0;
  ClientContext::Prepare
            ((ClientContext *)this,
             (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             statement_00);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  return (unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>)
         (unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>)
         this;
}

Assistant:

unique_ptr<PreparedStatement> Connection::Prepare(unique_ptr<SQLStatement> statement) {
	return context->Prepare(std::move(statement));
}